

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void Cmd_sizedown(FCommandLine *argv,APlayerPawn *who,int key)

{
  FSoundID local_4;
  
  FIntCVar::operator=(&screenblocks,screenblocks.Value + -1);
  S_FindSound("menu/change");
  S_Sound(0x22,&local_4,snd_menuvolume.Value,0.0);
  return;
}

Assistant:

CCMD (sizedown)
{
	screenblocks = screenblocks - 1;
	S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
}